

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void __thiscall
flatbuffers::ResizeContext::ResizeContext
          (ResizeContext *this,Schema *schema,uoffset_t start,int delta,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  Table *pTVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint uVar2;
  iterator iVar3;
  Table *table;
  size_t __n;
  iterator __position;
  size_type_conflict __n_00;
  uchar *__dest;
  value_type_conflict1 local_2b;
  allocator_type local_2a;
  value_type_conflict1 local_29;
  
  this->schema_ = schema;
  this->startptr_ =
       (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start + start;
  this->delta_ = delta;
  this->buf_ = flatbuf;
  local_29 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->dag_check_,
             (ulong)((long)(flatbuf->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(flatbuf->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start) >> 2,&local_29,&local_2a);
  uVar2 = this->delta_ + 7U & 0xfffffff8;
  this->delta_ = uVar2;
  if (uVar2 != 0) {
    pTVar1 = (Table *)(this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    if (pTVar1 == (Table *)0x0) {
      table = (Table *)0x0;
    }
    else {
      table = pTVar1 + *(uint *)pTVar1;
    }
    if ((Table *)this->startptr_ <= table && pTVar1 <= (Table *)this->startptr_) {
      *(uint *)pTVar1 = *(uint *)pTVar1 + uVar2;
      *(this->dag_check_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = '\x01';
    }
    if (root_table == (Object *)0x0) {
      root_table = (Object *)
                   (schema + (ulong)*(uint *)(schema + *(ushort *)
                                                        (schema + (0xc - (long)*(int *)schema))) +
                             (ulong)*(ushort *)(schema + (0xc - (long)*(int *)schema)));
    }
    ResizeTable(this,root_table,table);
    __n_00 = (size_type_conflict)this->delta_;
    this_00 = this->buf_;
    __position._M_current =
         (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + start;
    if ((long)__n_00 < 1) {
      if (this->delta_ != 0) {
        __dest = __position._M_current + __n_00;
        __n = (long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current;
        iVar3._M_current = __position._M_current;
        if (__n != 0) {
          memmove(__dest,__position._M_current,__n);
          iVar3._M_current =
               (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
        }
        if (iVar3._M_current != __dest + ((long)iVar3._M_current - (long)__position._M_current)) {
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_finish =
               __dest + ((long)iVar3._M_current - (long)__position._M_current);
        }
      }
    }
    else {
      local_2b = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                (this_00,__position,__n_00,&local_2b);
    }
  }
  return;
}

Assistant:

ResizeContext(const reflection::Schema &schema, uoffset_t start, int delta,
                std::vector<uint8_t> *flatbuf,
                const reflection::Object *root_table = nullptr)
      : schema_(schema),
        startptr_(flatbuf->data() + start),
        delta_(delta),
        buf_(*flatbuf),
        dag_check_(flatbuf->size() / sizeof(uoffset_t), false) {
    auto mask = static_cast<int>(sizeof(largest_scalar_t) - 1);
    delta_ = (delta_ + mask) & ~mask;
    if (!delta_) return;  // We can't shrink by less than largest_scalar_t.
    // Now change all the offsets by delta_.
    auto root = GetAnyRoot(buf_.data());
    Straddle<uoffset_t, 1>(buf_.data(), root, buf_.data());
    ResizeTable(root_table ? *root_table : *schema.root_table(), root);
    // We can now add or remove bytes at start.
    if (delta_ > 0)
      buf_.insert(buf_.begin() + start, delta_, 0);
    else
      buf_.erase(buf_.begin() + start + delta_, buf_.begin() + start);
  }